

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O3

void DrawBoingBallBand(GLfloat long_lo,GLfloat long_hi)

{
  double __x;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double __x_00;
  double dVar10;
  GLfloat GVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  GLfloat GVar18;
  float fVar19;
  float fVar20;
  GLfloat GVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  __x_00 = ((double)long_lo / 360.0) * 6.283185307179586;
  __x = ((double)(long_lo + 22.5) / 360.0) * 6.283185307179586;
  fVar12 = 0.0;
  do {
    if (DrawBoingBallBand::colorToggle == 0) {
      GVar11 = 0.95;
      GVar18 = 0.95;
      GVar21 = 0.95;
    }
    else {
      GVar11 = 0.8;
      GVar18 = 0.1;
      GVar21 = 0.1;
    }
    (*glad_glColor3f)(GVar11,GVar18,GVar21);
    DrawBoingBallBand::colorToggle = (int)(DrawBoingBallBand::colorToggle == 0);
    if (drawBallHow == DRAW_BALL_SHADOW) {
      (*glad_glColor3f)(0.35,0.35,0.35);
    }
    dVar1 = cos(((double)long_hi / 360.0) * 6.283185307179586);
    dVar2 = cos(__x_00);
    fVar19 = (float)dVar2 * 70.0;
    fVar20 = (float)dVar1 * 70.0;
    dVar10 = ((double)fVar12 / 360.0) * 6.283185307179586;
    dVar1 = cos(dVar10);
    dVar2 = sin(__x);
    dVar3 = cos(dVar10);
    dVar4 = sin(__x_00);
    fVar12 = fVar12 + 22.5;
    dVar5 = ((double)fVar12 / 360.0) * 6.283185307179586;
    dVar6 = cos(dVar5);
    dVar7 = sin(__x);
    fVar13 = (float)dVar7 * 70.0 * (float)dVar6;
    dVar6 = cos(dVar5);
    dVar7 = sin(__x_00);
    fVar14 = (float)dVar7 * 70.0 * (float)dVar6;
    fVar16 = (float)dVar2 * 70.0 * (float)dVar1;
    dVar1 = sin(dVar10);
    dVar2 = sin(__x);
    dVar6 = sin(dVar10);
    dVar7 = sin(__x_00);
    dVar10 = sin(dVar5);
    dVar8 = sin(__x);
    dVar5 = sin(dVar5);
    dVar9 = sin(__x_00);
    fVar15 = (float)dVar9 * 70.0 * (float)dVar5;
    fVar17 = (float)dVar2 * 70.0 * (float)dVar1;
    (*glad_glBegin)(9);
    fVar22 = fVar13 - fVar16;
    fVar23 = fVar14 - fVar16;
    fVar24 = fVar15 - fVar17;
    (*glad_glNormal3f)((fVar20 - fVar20) * fVar24 - fVar24 * (fVar19 - fVar20),
                       (fVar20 - fVar17) * fVar23 - fVar24 * fVar22,
                       (fVar19 - fVar20) * fVar22 - fVar23 * (fVar20 - fVar20));
    (*glad_glVertex3f)(fVar16,fVar20,fVar17);
    (*glad_glVertex3f)(fVar13,fVar20,(float)dVar8 * 70.0 * (float)dVar10);
    (*glad_glVertex3f)(fVar14,fVar19,fVar15);
    (*glad_glVertex3f)((float)dVar4 * 70.0 * (float)dVar3,fVar19,(float)dVar7 * 70.0 * (float)dVar6)
    ;
    (*glad_glEnd)();
  } while (fVar12 <= 337.5);
  DrawBoingBallBand::colorToggle = (uint)(DrawBoingBallBand::colorToggle == 0);
  return;
}

Assistant:

void DrawBoingBallBand( GLfloat long_lo,
                        GLfloat long_hi )
{
   vertex_t vert_ne;            /* "ne" means south-east, so on */
   vertex_t vert_nw;
   vertex_t vert_sw;
   vertex_t vert_se;
   vertex_t vert_norm;
   GLfloat  lat_deg;
   static int colorToggle = 0;

  /*
   * Iterate thru the points of a latitude circle.
   * A latitude circle is a 2D set of X,Z points.
   */
   for ( lat_deg = 0;
         lat_deg <= (360 - STEP_LATITUDE);
         lat_deg += STEP_LATITUDE )
   {
     /*
      * Color this polygon with red or white.
      */
      if ( colorToggle )
         glColor3f( 0.8f, 0.1f, 0.1f );
      else
         glColor3f( 0.95f, 0.95f, 0.95f );
#if 0
      if ( lat_deg >= 180 )
         if ( colorToggle )
            glColor3f( 0.1f, 0.8f, 0.1f );
         else
            glColor3f( 0.5f, 0.5f, 0.95f );
#endif
      colorToggle = ! colorToggle;

     /*
      * Change color if drawing shadow.
      */
      if ( drawBallHow == DRAW_BALL_SHADOW )
         glColor3f( 0.35f, 0.35f, 0.35f );

     /*
      * Assign each Y.
      */
      vert_ne.y = vert_nw.y = (float) cos_deg(long_hi) * RADIUS;
      vert_sw.y = vert_se.y = (float) cos_deg(long_lo) * RADIUS;

     /*
      * Assign each X,Z with sin,cos values scaled by latitude radius indexed by longitude.
      * Eg, long=0 and long=180 are at the poles, so zero scale is sin(longitude),
      * while long=90 (sin(90)=1) is at equator.
      */
      vert_ne.x = (float) cos_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_se.x = (float) cos_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo                  ));
      vert_nw.x = (float) cos_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_sw.x = (float) cos_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo                  ));

      vert_ne.z = (float) sin_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_se.z = (float) sin_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo                  ));
      vert_nw.z = (float) sin_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_sw.z = (float) sin_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo                  ));

     /*
      * Draw the facet.
      */
      glBegin( GL_POLYGON );

      CrossProduct( vert_ne, vert_nw, vert_sw, &vert_norm );
      glNormal3f( vert_norm.x, vert_norm.y, vert_norm.z );

      glVertex3f( vert_ne.x, vert_ne.y, vert_ne.z );
      glVertex3f( vert_nw.x, vert_nw.y, vert_nw.z );
      glVertex3f( vert_sw.x, vert_sw.y, vert_sw.z );
      glVertex3f( vert_se.x, vert_se.y, vert_se.z );

      glEnd();

#if BOING_DEBUG
      printf( "----------------------------------------------------------- \n" );
      printf( "lat = %f  long_lo = %f  long_hi = %f \n", lat_deg, long_lo, long_hi );
      printf( "vert_ne  x = %.8f  y = %.8f  z = %.8f \n", vert_ne.x, vert_ne.y, vert_ne.z );
      printf( "vert_nw  x = %.8f  y = %.8f  z = %.8f \n", vert_nw.x, vert_nw.y, vert_nw.z );
      printf( "vert_se  x = %.8f  y = %.8f  z = %.8f \n", vert_se.x, vert_se.y, vert_se.z );
      printf( "vert_sw  x = %.8f  y = %.8f  z = %.8f \n", vert_sw.x, vert_sw.y, vert_sw.z );
#endif

   }

  /*
   * Toggle color so that next band will opposite red/white colors than this one.
   */
   colorToggle = ! colorToggle;

  /*
   * This circular band is done.
   */
   return;
}